

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNsPtr xmlCopyNamespaceList(xmlNsPtr cur)

{
  xmlNsPtr pxVar1;
  xmlNsPtr pxVar2;
  xmlNsPtr cur_00;
  xmlNsPtr pxVar3;
  
  if (cur == (xmlNsPtr)0x0) {
    return (xmlNsPtr)0x0;
  }
  cur_00 = (xmlNsPtr)0x0;
  pxVar3 = (xmlNsPtr)0x0;
  do {
    if ((cur->type != XML_NAMESPACE_DECL) ||
       (pxVar1 = xmlNewNs((xmlNodePtr)0x0,cur->href,cur->prefix), pxVar1 == (xmlNsPtr)0x0)) {
      xmlFreeNsList(cur_00);
      return (xmlNsPtr)0x0;
    }
    pxVar2 = pxVar1;
    if (pxVar3 != (xmlNsPtr)0x0) {
      pxVar3->next = pxVar1;
      pxVar2 = cur_00;
    }
    cur = cur->next;
    cur_00 = pxVar2;
    pxVar3 = pxVar1;
  } while (cur != (_xmlNs *)0x0);
  return pxVar2;
}

Assistant:

xmlNsPtr
xmlCopyNamespaceList(xmlNsPtr cur) {
    xmlNsPtr ret = NULL;
    xmlNsPtr p = NULL,q;

    while (cur != NULL) {
        q = xmlCopyNamespace(cur);
        if (q == NULL) {
            xmlFreeNsList(ret);
            return(NULL);
        }
	if (p == NULL) {
	    ret = p = q;
	} else {
	    p->next = q;
	    p = q;
	}
	cur = cur->next;
    }
    return(ret);
}